

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzingParameterSet.cpp
# Opt level: O1

void __thiscall FuzzingParameterSet::randomize_parameters(FuzzingParameterSet *this,bool print)

{
  double dVar1;
  Range<int> range_N_sided;
  int iVar2;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a0;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58;
  string local_48;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  
  if (this->num_activations_per_tREFI < 1) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "Called FuzzingParameterSet::randomize_parameters without valid num_activations_per_tREFI."
               ,"");
    Logger::log_error(&local_48,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT44(local_48.field_2._M_allocated_capacity._4_4_,
                               local_48.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  else {
    if (print) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Randomizing fuzzing parameters.","");
      Logger::log_info(&local_48,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,
                        CONCAT44(local_48.field_2._M_allocated_capacity._4_4_,
                                 local_48.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    (this->N_sided).min = 1;
    (this->N_sided).max = 2;
    (this->N_sided).step = 1;
    (this->N_sided).dist._M_param._M_a = 1;
    (this->N_sided).dist._M_param._M_b = 2;
    iVar2 = this->num_activations_per_tREFI / 2;
    (this->amplitude).max = iVar2;
    (this->amplitude).step = 1;
    (this->amplitude).dist._M_param._M_a = 1;
    (this->amplitude).dist._M_param._M_b = iVar2;
    (this->use_sequential_aggressors).min = 0;
    (this->use_sequential_aggressors).max = 1;
    (this->use_sequential_aggressors).step = 1;
    (this->use_sequential_aggressors).dist._M_param._M_a = 0;
    *(undefined8 *)&(this->use_sequential_aggressors).dist._M_param._M_b = 0x100000001;
    (this->sync_each_ref).min = 0;
    (this->sync_each_ref).max = 0;
    (this->sync_each_ref).step = 1;
    (this->sync_each_ref).dist._M_param._M_a = 0;
    *(undefined8 *)&(this->sync_each_ref).dist._M_param._M_b = 0xa00000000;
    (this->wait_until_start_hammering_refs).max = 0x80;
    (this->wait_until_start_hammering_refs).step = 1;
    (this->wait_until_start_hammering_refs).dist._M_param = (param_type)0x800000000a;
    (this->num_aggressors_for_sync).min = 2;
    (this->num_aggressors_for_sync).max = 2;
    (this->num_aggressors_for_sync).step = 1;
    (this->num_aggressors_for_sync).dist._M_param._M_a = 2;
    (this->num_aggressors_for_sync).dist._M_param._M_b = 2;
    (this->start_row).min = 0;
    (this->start_row).max = 0x800;
    (this->start_row).step = 1;
    (this->start_row).dist._M_param._M_a = 0;
    (this->start_row).dist._M_param._M_b = 0x800;
    local_48._M_dataplus._M_p = (pointer)0x200000002;
    local_48._M_string_length = 0x200000001;
    local_48.field_2._M_allocated_capacity._0_4_ = 2;
    iVar2 = Range<int>::get_random_number((Range<int> *)&local_48,&this->gen);
    this->agg_intra_distance = iVar2;
    this->flushing_strategy = EARLIEST_POSSIBLE;
    this->fencing_strategy = LATEST_POSSIBLE;
    local_58 = (this->N_sided).dist._M_param._M_b;
    local_68._0_4_ = (this->N_sided).min;
    local_68._4_4_ = (this->N_sided).max;
    uStack_60._0_4_ = (this->N_sided).step;
    uStack_60._4_4_ = (this->N_sided).dist._M_param._M_a;
    local_48._M_dataplus._M_p = (pointer)0x1400000001;
    local_48._M_string_length = 0x5000000002;
    std::
    _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_Hashtable<std::pair<int_const,int>const*>
              ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&local_a0,&local_48,&local_48.field_2,0,&local_23,&local_22,&local_21);
    range_N_sided.step = (undefined4)uStack_60;
    range_N_sided.dist._M_param._M_a = uStack_60._4_4_;
    range_N_sided.min = (undefined4)local_68;
    range_N_sided.max = local_68._4_4_;
    range_N_sided.dist._M_param._M_b = local_58;
    set_distribution(this,range_N_sided,
                     (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                      *)&local_a0);
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_a0);
    this->hammering_total_num_activations = 5000000;
    this->max_row_no = 0x2000;
    local_48._M_dataplus._M_p = (pointer)0x6000000008;
    local_48._M_string_length = 0x800000001;
    local_48.field_2._M_allocated_capacity._0_4_ = 0x60;
    iVar2 = Range<int>::get_random_number((Range<int> *)&local_48,&this->gen);
    this->num_aggressors = iVar2;
    local_48._M_dataplus._M_p = (pointer)0x400000000;
    local_48._M_string_length = 1;
    local_48.field_2._M_allocated_capacity._0_4_ = 4;
    iVar2 = Range<int>::get_random_number((Range<int> *)&local_48,&this->gen);
    dVar1 = ldexp(1.0,iVar2);
    this->num_refresh_intervals = (int)dVar1;
    iVar2 = (int)dVar1 * this->num_activations_per_tREFI;
    this->total_acts_pattern = iVar2;
    iVar2 = get_random_even_divisior(this,iVar2,4);
    this->base_period = iVar2;
    local_48._M_dataplus._M_p = (pointer)0x1800000001;
    local_48._M_string_length = 0x100000001;
    local_48.field_2._M_allocated_capacity._0_4_ = 0x18;
    iVar2 = Range<int>::get_random_number((Range<int> *)&local_48,&this->gen);
    this->agg_inter_distance = iVar2;
    if (print) {
      print_semi_dynamic_parameters(this);
    }
  }
  return;
}

Assistant:

void FuzzingParameterSet::randomize_parameters(bool print) {
  if (num_activations_per_tREFI <= 0) {
    Logger::log_error(
        "Called FuzzingParameterSet::randomize_parameters without valid num_activations_per_tREFI.");
    return;
  }

  if (print)
    Logger::log_info("Randomizing fuzzing parameters.");

  // █████████ DYNAMIC FUZZING PARAMETERS ████████████████████████████████████████████████████
  // are randomized for each added aggressor

  // [derivable from aggressors in AggressorAccessPattern]
  // note that in PatternBuilder::generate also uses 1-sided aggressors in case that the end of a base period needs to
  // be filled up
  N_sided = Range<int>(1, 2);

  // [exported as part of AggressorAccessPattern]
  // choosing as max 'num_activations_per_tREFI/N_sided.min' allows hammering an agg pair for a whole REF interval;
  // we set the upper bound in dependent of N_sided.min but need to (manually) exclude 1 because an amplitude>1 does
  // not make sense for a single aggressor
  amplitude = Range<int>(1, num_activations_per_tREFI/2);

  // == are randomized for each different set of addresses a pattern is probed with ======

  // [derivable from aggressor_to_addr (DRAMAddr) in PatternAddressMapper]
  use_sequential_aggressors = Range<int>(0, 1);

  // sync_each_ref = 1 means that we sync after every refresh interval, otherwise we only sync after hammering
  // the whole pattern (which may consists of more than one REF interval)
  sync_each_ref = Range<int>(0, 0);

  // [CANNOT be derived from anywhere else - but does not fit anywhere: will print to stdout only, not include in json]
  wait_until_start_hammering_refs = Range<int>(10, 128);

  // [CANNOT be derived from anywhere else - but does not fit anywhere: will print to stdout only, not include in json]
  num_aggressors_for_sync = Range<int>(2, 2);

  // [derivable from aggressor_to_addr (DRAMAddr) in PatternAddressMapper]
  start_row = Range<int>(0, 2048);

  // █████████ STATIC FUZZING PARAMETERS ████████████████████████████████████████████████████
  // fix values/formulas that must be configured before running this program

  // [derivable from aggressor_to_addr (DRAMAddr) in PatternAddressMapper]
  agg_intra_distance = Range<int>(2, 2).get_random_number(gen);

  // TODO: make this a dynamic fuzzing parameter that is randomized for each probed address set
  // [CANNOT be derived from anywhere else - but does not fit anywhere: will print to stdout only, not include in json]
//  auto strategy = get_valid_strategy_pair();
  flushing_strategy = FLUSHING_STRATEGY::EARLIEST_POSSIBLE;
  fencing_strategy = FENCING_STRATEGY::LATEST_POSSIBLE;

  // [CANNOT be derived from anywhere else - must explicitly be exported]
  // if N_sided = (1,2) and this is {{1,2},{2,8}}, then this translates to:
  // pick a 1-sided pair with 20% probability and a 2-sided pair with 80% probability
  // Note if using N_sided = Range<int>(min, max, step), then the X values provided here as (X, Y) correspond to
  // the multiplier (e.g., multiplier's minimum is min/step and multiplier's maximum is max/step)
  set_distribution(N_sided, {{1, 20}, {2, 80}});

  // [CANNOT be derived from anywhere else - must explicitly be exported]
  // hammering_total_num_activations is derived as follow:
  //    REF interval: 7.8 μs (tREFI), retention time: 64 ms   => about 8k REFs per refresh window
  //    num_activations_per_tREFI ≈100                       => 8k * 100 ≈ 8M activations and we hammer for 5M acts.
  hammering_total_num_activations = 5000000;

  max_row_no = 8192;

  // █████████ SEMI-DYNAMIC FUZZING PARAMETERS ████████████████████████████████████████████████████
  // are only randomized once when calling this function

  // [derivable from aggressors in AggressorAccessPattern, also not very expressive because different agg IDs can be
  // mapped to the same DRAM address]
  num_aggressors = Range<int>(8, 96).get_random_number(gen);

  // [included in HammeringPattern]
  // it is important that this is a power of two, otherwise the aggressors in the pattern will not respect frequencies
  num_refresh_intervals = static_cast<int>(std::pow(2, Range<int>(0, 4).get_random_number(gen)));

  // [included in HammeringPattern]
  total_acts_pattern = num_activations_per_tREFI*num_refresh_intervals;

  // [included in HammeringPattern]
  base_period = get_random_even_divisior(total_acts_pattern, 4);

  // [derivable from aggressor_to_addr (DRAMAddr) in PatternAddressMapper]
  agg_inter_distance = Range<int>(1, 24).get_random_number(gen);
  
  if (print) print_semi_dynamic_parameters();
}